

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

void __thiscall
CompilerContext::compile_switch_withop
          (CompilerContext *this,SyntaxTree *swnode,
          vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *cases,
          shared_ptr<Label> *break_ptr)

{
  pointer pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppCVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *pvVar5;
  bool bVar6;
  int32_t i;
  int iVar7;
  SwitchAnnotation *pSVar8;
  ulong uVar9;
  pointer ppCVar10;
  Case *c;
  long lVar11;
  pointer pCVar12;
  long lVar13;
  Case *pCVar14;
  Command *command;
  shared_ptr<Label> *__args;
  Case *pCVar15;
  __normal_iterator<CompilerContext::Case_**,_std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>_>
  __i;
  pointer ppCVar16;
  bool bVar17;
  vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> sorted_cases;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  args;
  vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_> local_108;
  anon_union_48_3_1618c560_for__union<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false>_3
  local_e8;
  undefined8 local_b8;
  SyntaxTree *local_b0;
  pointer local_a8;
  pointer pvStack_a0;
  pointer local_98;
  shared_ptr<Label> local_88;
  shared_ptr<Label> local_78;
  vector<CompilerContext::Case,_std::allocator<CompilerContext::Case>_> *local_68;
  shared_ptr<Label> *local_60;
  Command *local_58;
  Command *local_50;
  vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
  local_48;
  
  local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>::resize
            (&local_108,
             ((long)(cases->
                    super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(cases->
                    super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  pSVar8 = SyntaxTree::annotation<SwitchAnnotation_const&>(swnode);
  bVar6 = pSVar8->has_default;
  local_50 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_start);
  local_58 = std::experimental::optional<const_Command_&>::value(&this->commands->switch_continued);
  ppCVar2 = local_108.
            super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar10 = local_108.
             super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (cases->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  ppCVar16 = local_108.
             super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (pCVar12 = (cases->
                 super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
                 _M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar1; pCVar12 = pCVar12 + 1)
  {
    *ppCVar16 = pCVar12;
    ppCVar16 = ppCVar16 + 1;
  }
  local_b0 = swnode;
  if (local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar11 = (long)local_108.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = lVar11 >> 3;
    lVar13 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar13 == 0; lVar13 = lVar13 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
              (local_108.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_108.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar11 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
                (ppCVar10,ppCVar2);
    }
    else {
      ppCVar16 = ppCVar10 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<CompilerContext::Case**,std::vector<CompilerContext::Case*,std::allocator<CompilerContext::Case*>>>,__gnu_cxx::__ops::_Iter_comp_iter<CompilerContext::compile_switch_withop(SyntaxTree_const&,std::vector<CompilerContext::Case,std::allocator<CompilerContext::Case>>&,std::shared_ptr<Label>)::__1>>
                (ppCVar10,ppCVar16);
      for (; ppCVar16 != ppCVar2; ppCVar16 = ppCVar16 + 1) {
        pCVar14 = *ppCVar16;
        ppCVar10 = ppCVar16;
        if ((pCVar14->value).super_OptionalBase<int>.init_ == true) {
          while ((pCVar15 = ppCVar10[-1], (pCVar15->value).super_OptionalBase<int>.init_ != true ||
                 ((pCVar14->value).super_OptionalBase<int>.storage_.value_ <
                  (pCVar15->value).super_OptionalBase<int>.storage_.value_))) {
            *ppCVar10 = pCVar15;
            ppCVar10 = ppCVar10 + -1;
          }
        }
        *ppCVar10 = pCVar14;
      }
    }
  }
  if (bVar6 == false) {
    pCVar14 = (Case *)0x0;
  }
  else {
    pCVar14 = local_108.
              super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1];
    local_108.super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_108.
         super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    if ((pCVar14->value).super_OptionalBase<int>.init_ == true) {
      __assert_fail("case_default->is_default()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/compiler.cpp"
                    ,0x17c,
                    "void CompilerContext::compile_switch_withop(const SyntaxTree &, std::vector<Case> &, shared_ptr<Label>)"
                   );
    }
  }
  pCVar12 = (cases->
            super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (cases->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = cases;
  if (pCVar12 != pCVar1) {
    do {
      make_internal_label((CompilerContext *)&local_e8._tail);
      uVar4 = local_e8._8_8_;
      uVar3 = local_e8._0_8_;
      local_e8._0_8_ = (element_type *)0x0;
      local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_00 = (pCVar12->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (pCVar12->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar3;
      (pCVar12->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      pCVar12 = pCVar12 + 1;
    } while (pCVar12 != pCVar1);
  }
  if (local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_60 = &pCVar14->target;
    if (bVar6 == false) {
      local_60 = break_ptr;
    }
    uVar9 = 0;
    do {
      local_a8 = (pointer)0x0;
      pvStack_a0 = (pointer)0x0;
      local_98 = (pointer)0x0;
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::reserve((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                 *)&local_a8,0x12);
      bVar17 = uVar9 != 0;
      command = local_58;
      if (!bVar17) {
        command = local_50;
      }
      lVar13 = (ulong)bVar17 * 2 + 7;
      if (!bVar17) {
        get_arg((ArgVariant *)&local_e8._tail,this,
                (((local_b0->childs).
                  super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,
                   (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                    *)&local_e8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                    *)&local_e8._tail);
        lVar11 = (long)local_108.
                       super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_108.
                       super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
        iVar7 = (int)lVar11;
        if ((char)lVar11 == iVar7) {
          local_e8._target = (char)lVar11;
          local_b8 = 2;
        }
        else if ((short)lVar11 == iVar7) {
          local_e8._0_2_ = (short)lVar11;
          local_b8 = 3;
        }
        else {
          local_e8._0_4_ = iVar7;
          local_b8 = 4;
        }
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,
                   (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                    *)&local_e8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                    *)&local_e8._tail);
        local_e8._target = bVar6;
        local_b8 = 2;
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::
        emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,
                   (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                    *)&local_e8._tail);
        eggs::variants::detail::
        _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
        ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                    *)&local_e8._tail);
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::emplace_back<std::shared_ptr<Label>const&>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,local_60);
      }
      do {
        if (uVar9 < (ulong)((long)local_108.
                                  super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_108.
                                  super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
          if ((local_108.
               super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9]->value).super_OptionalBase<int>.
              init_ == false) {
            __assert_fail("initialized()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/deps/optional/include/optional/optional.hpp"
                          ,0x204,"T &std::experimental::optional<int>::operator*() & [T = int]");
          }
          iVar7 = (local_108.
                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9]->value).super_OptionalBase<int>.
                  storage_.value_;
          if ((char)iVar7 == iVar7) {
            local_e8._target = (char)iVar7;
            local_b8 = 2;
          }
          else if ((short)iVar7 == iVar7) {
            local_e8._0_2_ = (short)iVar7;
            local_b8 = 3;
          }
          else {
            local_e8._0_4_ = iVar7;
            local_b8 = 4;
          }
          std::
          vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
          ::
          emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                    ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                      *)&local_a8,
                     (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                      *)&local_e8._tail);
          eggs::variants::detail::
          _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
          ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                      *)&local_e8._tail);
          __args = &local_108.
                    super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar9]->target;
        }
        else {
          local_e8._target = 0xff;
          local_b8 = 2;
          std::
          vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
          ::
          emplace_back<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>
                    ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                      *)&local_a8,
                     (variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>
                      *)&local_e8._tail);
          eggs::variants::detail::
          _storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
          ::_destroy((_storage<eggs::variants::detail::pack<eggs::variants::detail::empty,_EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_false,_false>
                      *)&local_e8._tail);
          __args = break_ptr;
        }
        std::
        vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
        ::emplace_back<std::shared_ptr<Label>&>
                  ((vector<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>,std::allocator<eggs::variants::variant<EOAL,signed_char,short,int,float,std::shared_ptr<Label>,CompiledVar,CompiledString>>>
                    *)&local_a8,__args);
        uVar9 = uVar9 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
      local_48.
      super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_a8;
      local_48.
      super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvStack_a0;
      local_48.
      super__Vector_base<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_98;
      local_a8 = (pointer)0x0;
      pvStack_a0 = (pointer)0x0;
      local_98 = (pointer)0x0;
      compile_command(this,command,&local_48,false);
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::~vector(&local_48);
      std::
      vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
      ::~vector((vector<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>,_std::allocator<eggs::variants::variant<EOAL,_signed_char,_short,_int,_float,_std::shared_ptr<Label>,_CompiledVar,_CompiledString>_>_>
                 *)&local_a8);
    } while (uVar9 < (ulong)((long)local_108.
                                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_108.
                                   super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pvVar5 = local_68;
  pCVar14 = (local_68->
            super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (pCVar14 !=
      (local_68->super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pCVar15 = pCVar14 + 1;
      local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pCVar14->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (pCVar14->target).super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)->_M_use_count + 1;
        }
      }
      std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
                ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,&local_78);
      if (local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ;
      }
      if ((pCVar15 ==
           (pvVar5->
           super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
           _M_impl.super__Vector_impl_data._M_finish) ||
         (bVar6 = Case::same_body_as(pCVar15,pCVar14), !bVar6)) {
        compile_statements(this,(local_b0->childs).
                                super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].
                                super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           pCVar14->first_statement_id,pCVar14->last_statement_id);
      }
      pCVar14 = pCVar15;
    } while (pCVar15 !=
             (pvVar5->
             super__Vector_base<CompilerContext::Case,_std::allocator<CompilerContext::Case>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (break_ptr->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (break_ptr->super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  std::vector<CompiledData,std::allocator<CompiledData>>::emplace_back<std::shared_ptr<Label>>
            ((vector<CompiledData,std::allocator<CompiledData>> *)&this->compiled,&local_88);
  if (local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_108.
      super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.
                    super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<CompilerContext::Case_*,_std::allocator<CompilerContext::Case_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CompilerContext::compile_switch_withop(const SyntaxTree& swnode, std::vector<Case>& cases, shared_ptr<Label> break_ptr)
{
    std::vector<Case*> sorted_cases;   // does not contain default, unlike `cases`
    sorted_cases.resize(cases.size());
    bool has_default = swnode.annotation<const SwitchAnnotation&>().has_default;
    const Case* case_default = nullptr;

    const Command& switch_start     = this->commands.switch_start.value();
    const Command& switch_continued = this->commands.switch_continued.value();

    std::transform(cases.begin(), cases.end(), sorted_cases.begin(), [] (auto& c) { return std::addressof<Case>(c); });

    std::sort(sorted_cases.begin(), sorted_cases.end(), [](const Case* a, const Case* b) {
        if(a->is_default()) return false; // default should be the last
        if(b->is_default()) return true;  // !a->is_default() == true
        return *a->value < *b->value;
    });

    if(has_default)
    {
        case_default = sorted_cases.back();
        sorted_cases.pop_back();
        assert(case_default->is_default());
    }

    for(auto& c : cases)
        c.target = make_internal_label();

    for(size_t i = 0; i < sorted_cases.size(); )
    {
        std::vector<ArgVariant> args;
        args.reserve(18);

        const Command& switch_op = (i == 0? switch_start : switch_continued);
        size_t max_cases_here    = (i == 0? 7 : 9);

        if(i == 0)
        {
            args.emplace_back(get_arg(swnode.child(0)));
            args.emplace_back(conv_int(sorted_cases.size()));
            args.emplace_back(conv_int(has_default));
            args.emplace_back(has_default? case_default->target : break_ptr);
        }

        for(size_t k = 0; k < max_cases_here; ++k, ++i)
        {
            if(i < sorted_cases.size())
            {
                args.emplace_back(conv_int(*sorted_cases[i]->value));
                args.emplace_back(sorted_cases[i]->target);
            }
            else
            {
                args.emplace_back(conv_int(-1));
                args.emplace_back(break_ptr);
            }
        }

        compile_command(switch_op, std::move(args));
    }

    for(auto it = cases.begin(); it != cases.end(); ++it)
    {
        compile_label(it->target);
        if(std::next(it) == cases.end() || !std::next(it)->same_body_as(*it))
        {
            compile_statements(swnode.child(1), it->first_statement_id, it->last_statement_id);
        }
    }

    compile_label(break_ptr);
}